

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

TablePrinter * Catch::operator<<(TablePrinter *tp)

{
  _Alloc_hider _Var1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  long **__file;
  long lVar5;
  pointer pCVar6;
  string padding;
  value_type colInfo;
  string colStr;
  char local_99;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  long *local_78 [2];
  long local_68 [2];
  ulong local_58;
  Justification local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__cxx11::stringbuf::str();
  lVar2 = local_40;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  __file = local_78;
  std::__cxx11::stringbuf::str((string *)((tp->m_oss).m_oss + 8));
  iVar3 = extraout_EDX;
  if (local_78[0] != local_68) {
    __file = (long **)(local_68[0] + 1);
    operator_delete(local_78[0],(ulong)__file);
    iVar3 = extraout_EDX_00;
  }
  TablePrinter::open(tp,(char *)__file,iVar3);
  iVar3 = tp->m_currentColumn;
  pCVar6 = (tp->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar3 == (int)((ulong)((long)(tp->m_columnInfos).
                                   super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) >> 4)
               * -0x55555555 + -1) {
    tp->m_currentColumn = -1;
    local_78[0] = (long *)CONCAT71(local_78[0]._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,(char *)local_78,1);
    iVar3 = tp->m_currentColumn;
    pCVar6 = (tp->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  iVar3 = iVar3 + 1;
  tp->m_currentColumn = iVar3;
  _Var1._M_p = pCVar6[iVar3].name._M_dataplus._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,_Var1._M_p,_Var1._M_p + pCVar6[iVar3].name._M_string_length);
  local_50 = pCVar6[iVar3].justification;
  local_58 = pCVar6[iVar3].width;
  local_98 = &local_88;
  lVar5 = local_58 - (lVar2 + 1U);
  if (local_58 < lVar2 + 1U || lVar5 == 0) {
    local_90 = 0;
    local_88 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)lVar5);
  }
  if (local_50 == Left) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,(char *)local_48,local_40);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
    local_99 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_99,1);
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,local_98,local_90);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_48,local_40);
    local_99 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_99,1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        const auto strSize = colStr.size();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << '\n';
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 1 < colInfo.width)
            ? std::string(colInfo.width - (strSize + 1), ' ')
            : std::string();
        if (colInfo.justification == Justification::Left)
            tp.m_os << colStr << padding << ' ';
        else
            tp.m_os << padding << colStr << ' ';
        return tp;
    }